

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_expression.c
# Opt level: O0

AST * parse_postfix_expression(Translation_Data *translation_data,Scope *scope)

{
  char cVar1;
  token *ptVar2;
  AST_Lvalue_Expression *pAVar3;
  AST *right;
  AST_Error *pAVar4;
  AST_Function_Expression *pAVar5;
  AST *hold_expr;
  AST *hold;
  Scope *scope_local;
  Translation_Data *translation_data_local;
  
  hold_expr = parse_primary_expression(translation_data,scope);
  do {
    if (translation_data->tokens->size == 0) {
      return hold_expr;
    }
    switch(*translation_data->tokens->first->data) {
    case 0x26:
      chomp(translation_data);
      pAVar5 = parse_arglist(translation_data,scope,hold_expr);
      return (AST *)pAVar5;
    default:
      return hold_expr;
    case 0x2c:
      chomp(translation_data);
      cVar1 = check(translation_data,KW_ID,0);
      if (cVar1 != '\0') {
        ptVar2 = (token *)Queue_Pop(translation_data->tokens);
        pAVar3 = get_lvalue_expression_tree(ptVar2,scope);
        hold_expr = (AST *)get_binary_expression_tree(hold_expr,(AST *)pAVar3,OP_MEMBER_TROUGH_PTR);
      }
      break;
    case 0x34:
      chomp(translation_data);
      cVar1 = get_and_check(translation_data,KW_CLOSE_SQUARE);
      if (cVar1 == '\0') {
        right = parse_expression(translation_data,scope);
        hold_expr = (AST *)get_binary_expression_tree(hold_expr,right,OP_ARR_SUBSCRIPT);
        cVar1 = get_and_check(translation_data,KW_CLOSE_SQUARE);
        if (cVar1 == '\0') {
          push_translation_error("expected \']\' here",translation_data);
          pAVar4 = get_error_tree(hold_expr);
          return (AST *)pAVar4;
        }
      }
      else {
        hold_expr = (AST *)get_binary_expression_tree(hold_expr,(AST *)0x0,OP_ARR_SUBSCRIPT);
      }
      break;
    case 0x3d:
      chomp(translation_data);
      hold_expr = (AST *)get_unary_expression_tree(hold_expr,OP_POSTFIX_INC);
      break;
    case 0x3e:
      chomp(translation_data);
      hold_expr = (AST *)get_unary_expression_tree(hold_expr,OP_POSTFIX_DEC);
      break;
    case 0x4d:
      chomp(translation_data);
      cVar1 = check(translation_data,KW_ID,0);
      if (cVar1 != '\0') {
        ptVar2 = (token *)Queue_Pop(translation_data->tokens);
        pAVar3 = get_lvalue_expression_tree(ptVar2,scope);
        hold_expr = (AST *)get_binary_expression_tree(hold_expr,(AST *)pAVar3,OP_MEMBER);
      }
    }
  } while( true );
}

Assistant:

struct AST* parse_postfix_expression(struct Translation_Data *translation_data,struct Scope *scope)
{
	
	struct AST *hold;
	struct AST *hold_expr;

	
	hold=parse_primary_expression(translation_data,scope);

	while(translation_data->tokens->size!=0)
	{
		switch(((struct token*)translation_data->tokens->first->data)->type)
		{
			case KW_PLUSPLUS:
				chomp(translation_data);
				hold=(struct AST*)get_unary_expression_tree(hold,OP_POSTFIX_INC);
				break;
			case KW_MINUSMINUS:
				chomp(translation_data);
				hold=(struct AST*)get_unary_expression_tree(hold,OP_POSTFIX_DEC);
				break;
			case KW_DOT:
				chomp(translation_data);
				if(check(translation_data,KW_ID,0))
				{
					hold=(struct AST*)get_binary_expression_tree(hold,(struct AST*)get_lvalue_expression_tree(Queue_Pop(translation_data->tokens),scope),OP_MEMBER);
				}
				break;
			case KW_ARROW:
				chomp(translation_data);
				if(check(translation_data,KW_ID,0))
				{
					hold=(struct AST*)get_binary_expression_tree(hold,(struct AST*)get_lvalue_expression_tree(Queue_Pop(translation_data->tokens),scope),OP_MEMBER_TROUGH_PTR);
				}
				break;
			case KW_OPEN_SQUARE:

				chomp(translation_data);
				if(get_and_check(translation_data,KW_CLOSE_SQUARE))
				{
					hold=(struct AST*)get_binary_expression_tree(hold,NULL,OP_ARR_SUBSCRIPT);
				}else
				{
					hold_expr=parse_expression(translation_data,scope);
					hold=(struct AST*)get_binary_expression_tree(hold,hold_expr,OP_ARR_SUBSCRIPT);
					if(!get_and_check(translation_data,KW_CLOSE_SQUARE))
					{
						push_translation_error("expected ']' here",translation_data);
						return (struct AST*)get_error_tree(hold);
					}
				}
				break;
			case KW_OPEN_NORMAL:
				chomp(translation_data);
				return (struct AST*)parse_arglist(translation_data,scope,hold);
				break;

			default:
				return hold;
		}
	}

	return hold;
}